

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)56,_(unsigned_short)29>::Unpack
               (uint32_t **in,uint64_t *out)

{
  byte bVar1;
  uint uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  
  puVar3 = *in;
  bVar1 = *(byte *)((long)puVar3 + 3);
  out[0x1d] = (ulong)bVar1;
  *in = puVar3 + 1;
  uVar4 = (ulong)CONCAT41(puVar3[1],bVar1);
  out[0x1d] = uVar4;
  *in = puVar3 + 2;
  uVar2 = puVar3[2];
  out[0x1d] = (ulong)(uVar2 & 0xffff) << 0x28 | uVar4;
  uVar4 = (ulong)(uVar2 >> 0x10);
  out[0x1e] = uVar4;
  *in = puVar3 + 3;
  uVar4 = (ulong)puVar3[3] << 0x10 | uVar4;
  out[0x1e] = uVar4;
  *in = puVar3 + 4;
  uVar2 = puVar3[4];
  out[0x1e] = (ulong)(uVar2 & 0xff) << 0x30 | uVar4;
  uVar4 = (ulong)(uVar2 >> 8);
  out[0x1f] = uVar4;
  out[0x1f] = (ulong)puVar3[5] << 0x18 | uVar4;
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}